

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BinTree.h
# Opt level: O2

void __thiscall
axl::sl::
BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
::xcg(BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
      *this,RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *node1,
     RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *node2)

{
  RbColor RVar1;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar2;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar3;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar4;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar5;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar6;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> **ppRVar7;
  
  pRVar2 = (node1->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_left;
  pRVar3 = (node1->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_right;
  pRVar4 = (node2->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_left;
  if (pRVar4 == node1) {
    (node1->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = node2;
    (node1->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = (node2->
                super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                ).m_right;
  }
  else {
    pRVar5 = (node2->
             super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
             ).m_right;
    if (pRVar5 != node1) {
      pRVar6 = (node1->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_parent;
      if (pRVar2 == node2) {
        (node1->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_left = pRVar4;
        (node1->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_right = pRVar5;
        (node1->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_parent = node2;
        (node2->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_left = node1;
LAB_001279dd:
        (node2->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_right = pRVar3;
      }
      else {
        (node1->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_left = pRVar4;
        (node1->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_right = pRVar5;
        if (pRVar3 != node2) {
          (node1->
          super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
          ).m_parent = (node2->
                       super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                       ).m_parent;
          (node2->
          super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
          ).m_left = pRVar2;
          goto LAB_001279dd;
        }
        (node1->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_parent = node2;
        (node2->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_left = pRVar2;
        (node2->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_right = node1;
      }
      (node2->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_parent = pRVar6;
      goto LAB_001279f3;
    }
    (node1->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = pRVar4;
    (node1->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = node2;
  }
  (node1->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).m_parent = (node2->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_parent;
  (node2->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).m_left = pRVar2;
  (node2->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).m_right = pRVar3;
  (node2->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).m_parent = node1;
  pRVar6 = node1;
LAB_001279f3:
  pRVar2 = (node1->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_parent;
  if (pRVar2 == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    ppRVar7 = &this->m_root;
  }
  else {
    ppRVar7 = &(pRVar2->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_right;
    if ((pRVar2->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_left == node2) {
      ppRVar7 = &(pRVar2->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_left;
    }
  }
  *ppRVar7 = node1;
  if (pRVar6 == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    ppRVar7 = &this->m_root;
  }
  else {
    ppRVar7 = &(pRVar6->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_right;
    if ((pRVar6->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_left == node1) {
      ppRVar7 = &(pRVar6->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_left;
    }
  }
  *ppRVar7 = node2;
  pRVar2 = (node1->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_left;
  if (pRVar2 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    (pRVar2->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = node1;
  }
  pRVar2 = (node1->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_right;
  if (pRVar2 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    (pRVar2->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = node1;
  }
  pRVar2 = (node2->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_left;
  if (pRVar2 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    (pRVar2->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = node2;
  }
  pRVar2 = (node2->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_right;
  if (pRVar2 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    (pRVar2->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = node2;
  }
  RVar1 = node1->m_color;
  node1->m_color = node2->m_color;
  node2->m_color = RVar1;
  return;
}

Assistant:

void
	xcg(
		Node* node1,
		Node* node2
	) {
		Node* oldParent = node1->m_parent;
		Node* oldLeft = node1->m_left;
		Node* oldRight = node1->m_right;

		// special cases: direct parent-child relations

		if (node1 == node2->m_left) {
			node1->m_left = node2;
			node1->m_right = node2->m_right;
			node1->m_parent = node2->m_parent;

			node2->m_left = oldLeft;
			node2->m_right = oldRight;
			node2->m_parent = node1;
		} else if (node1 == node2->m_right) {
			node1->m_left = node2->m_left;
			node1->m_right = node2;
			node1->m_parent = node2->m_parent;

			node2->m_left = oldLeft;
			node2->m_right = oldRight;
			node2->m_parent = node1;
		} else if (node2 == node1->m_left) {
			node1->m_left = node2->m_left;
			node1->m_right = node2->m_right;
			node1->m_parent = node2;

			node2->m_left = node1;
			node2->m_right = oldRight;
			node2->m_parent = oldParent;
		} else if (node2 == node1->m_right) {
			node1->m_left = node2->m_left;
			node1->m_right = node2->m_right;
			node1->m_parent = node2;

			node2->m_left = oldLeft;
			node2->m_right = node1;
			node2->m_parent = oldParent;
		} else {
			node1->m_left = node2->m_left;
			node1->m_right = node2->m_right;
			node1->m_parent = node2->m_parent;

			node2->m_left = oldLeft;
			node2->m_right = oldRight;
			node2->m_parent = oldParent;
		}

		// fixup parents

		if (!node1->m_parent)
			m_root = node1;
		else if (node1->m_parent->m_left == node2)
			node1->m_parent->m_left = node1;
		else
			node1->m_parent->m_right = node1;

		if (!node2->m_parent)
			m_root = node2;
		else if (node2->m_parent->m_left == node1)
			node2->m_parent->m_left = node2;
		else
			node2->m_parent->m_right = node2;

		// fixup children

		if (node1->m_left)
			node1->m_left->m_parent = node1;

		if (node1->m_right)
			node1->m_right->m_parent = node1;

		if (node2->m_left)
			node2->m_left->m_parent = node2;

		if (node2->m_right)
			node2->m_right->m_parent = node2;

		Node::onXcg(node1, node2);
	}